

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O1

bool __thiscall
duckdb::CollectionScanState::ScanCommitted
          (CollectionScanState *this,DataChunk *result,SegmentLock *l,TableScanType type)

{
  RowGroup *pRVar1;
  
  pRVar1 = this->row_group;
  while ((pRVar1 != (RowGroup *)0x0 &&
         (RowGroup::ScanCommitted(pRVar1,this,result,type), result->count == 0))) {
    if (this->row_group == (RowGroup *)0x0) {
      pRVar1 = (RowGroup *)0x0;
    }
    else {
      pRVar1 = SegmentTree<duckdb::RowGroup,_true>::GetSegmentByIndex
                         (&this->row_groups->super_SegmentTree<duckdb::RowGroup,_true>,l,
                          (this->row_group->super_SegmentBase<duckdb::RowGroup>).index + 1);
    }
    this->row_group = pRVar1;
    if (pRVar1 != (RowGroup *)0x0) {
      RowGroup::InitializeScan(pRVar1,this);
    }
    pRVar1 = this->row_group;
  }
  return pRVar1 != (RowGroup *)0x0;
}

Assistant:

bool CollectionScanState::ScanCommitted(DataChunk &result, SegmentLock &l, TableScanType type) {
	while (row_group) {
		row_group->ScanCommitted(*this, result, type);
		if (result.size() > 0) {
			return true;
		} else {
			row_group = row_groups->GetNextSegment(l, row_group);
			if (row_group) {
				row_group->InitializeScan(*this);
			}
		}
	}
	return false;
}